

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lice.cc
# Opt level: O2

set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
P8Lice::getSensors_abi_cxx11_
          (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,P8Lice *this,time_t start,time_t stop)

{
  _Rb_tree_header *p_Var1;
  size_t i;
  ulong uVar2;
  long lVar3;
  vector<SensorReading,_std::allocator<SensorReading>_> allsens;
  vector<SensorReading,_std::allocator<SensorReading>_> local_38;
  
  getReadings(&local_38,this,start,stop);
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  lVar3 = 0;
  for (uVar2 = 0;
      uVar2 < (ulong)(((long)local_38.
                             super__Vector_base<SensorReading,_std::allocator<SensorReading>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                      (long)local_38.
                            super__Vector_base<SensorReading,_std::allocator<SensorReading>_>.
                            _M_impl.super__Vector_impl_data._M_start) / 0xb0); uVar2 = uVar2 + 1) {
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string_const&>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)__return_storage_ptr__,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&((local_38.super__Vector_base<SensorReading,_std::allocator<SensorReading>_>.
                         _M_impl.super__Vector_impl_data._M_start)->sensor_name)._M_dataplus._M_p +
               lVar3));
    lVar3 = lVar3 + 0xb0;
  }
  std::vector<SensorReading,_std::allocator<SensorReading>_>::~vector(&local_38);
  return __return_storage_ptr__;
}

Assistant:

set<string> P8Lice::getSensors(time_t start,time_t stop) {
	vector<SensorReading> allsens=getReadings(start,stop);
	set<string> ret;
	for(size_t i=0;i<allsens.size();i++)
		ret.insert(allsens[i].sensor_name);
	return ret;
}